

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DiagObjectModel.cpp
# Opt level: O0

int Js::LocalsWalker::GetAdjustedByteCodeOffset(DiagStackFrame *frame)

{
  bool bVar1;
  uint uVar2;
  int local_14;
  int offset;
  DiagStackFrame *frame_local;
  
  local_14 = (*frame->_vptr_DiagStackFrame[3])();
  bVar1 = DiagStackFrame::IsTopFrame(frame);
  if ((!bVar1) && (uVar2 = (*frame->_vptr_DiagStackFrame[0xc])(), (uVar2 & 1) != 0)) {
    local_14 = local_14 + -1;
  }
  return local_14;
}

Assistant:

int LocalsWalker::GetAdjustedByteCodeOffset(DiagStackFrame* frame)
    {
        int offset = frame->GetByteCodeOffset();
        if (!frame->IsTopFrame() && frame->IsInterpreterFrame())
        {
            // Native frames are already adjusted so just need to adjust interpreted
            // frames that are not the top frame.
            --offset;
        }

        return offset;
    }